

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O3

PHYSFS_Io * ZIP_openRead(void *opaque,char *filename)

{
  _func_PHYSFS_sint64_PHYSFS_Io_ptr_void_ptr_PHYSFS_uint64 *p_Var1;
  _func_void_PHYSFS_Io_ptr *p_Var2;
  mz_internal_state *pmVar3;
  void *pvVar4;
  mz_free_func p_Var5;
  undefined4 uVar6;
  int iVar7;
  ZIPentry *entry;
  PHYSFS_Io *pPVar8;
  ZIPfileinfo *finfo;
  PHYSFS_Io *pPVar9;
  ZIPentry *pZVar10;
  PHYSFS_uint8 *pPVar11;
  char *path;
  PHYSFS_sint64 PVar12;
  long lVar13;
  undefined1 *puVar14;
  PHYSFS_ErrorCode PVar15;
  undefined1 *ptr;
  PHYSFS_Io *pPVar16;
  PHYSFS_uint8 *pPVar17;
  size_t __n;
  byte bVar18;
  undefined1 auStack_48 [4];
  PHYSFS_uint8 local_44 [8];
  PHYSFS_uint8 crypto_header [12];
  
  bVar18 = 0;
  puVar14 = auStack_48;
  entry = (ZIPentry *)__PHYSFS_DirTreeFind((__PHYSFS_DirTree *)opaque,filename);
  if (entry == (ZIPentry *)0x0) {
    if (*(int *)((long)opaque + 0x2c) == 0) {
      return (PHYSFS_Io *)0x0;
    }
    crypto_header._4_8_ = strrchr(filename,0x24);
    if ((char *)crypto_header._4_8_ == (char *)0x0) {
      return (PHYSFS_Io *)0x0;
    }
    __n = crypto_header._4_8_ - (long)filename;
    if (__n + 1 < 0x100) {
      ptr = auStack_48 + -(__n + 0x18 & 0xfffffffffffffff0);
      puVar14 = ptr;
    }
    else {
      ptr = (undefined1 *)0x0;
      puVar14 = auStack_48;
    }
    *(undefined8 *)(puVar14 + -8) = 0x1151e4;
    path = (char *)__PHYSFS_initSmallAlloc(ptr,__n + 1);
    if (path != (char *)0x0) {
      *(undefined8 *)(puVar14 + -8) = 0x1151fa;
      memcpy(path,filename,__n);
      path[__n] = '\0';
      *(undefined8 *)(puVar14 + -8) = 0x11520a;
      entry = (ZIPentry *)__PHYSFS_DirTreeFind((__PHYSFS_DirTree *)opaque,path);
      *(undefined8 *)(puVar14 + -8) = 0x115215;
      __PHYSFS_smallFree(path);
      if (entry == (ZIPentry *)0x0) {
        return (PHYSFS_Io *)0x0;
      }
      pPVar17 = (PHYSFS_uint8 *)(crypto_header._4_8_ + 1);
      goto LAB_00115044;
    }
LAB_00115226:
    PVar15 = PHYSFS_ERR_OUT_OF_MEMORY;
LAB_0011522b:
    *(undefined8 *)(puVar14 + -8) = 0x115230;
    PHYSFS_setErrorCode(PVar15);
    return (PHYSFS_Io *)0x0;
  }
  pPVar17 = (PHYSFS_uint8 *)0x0;
LAB_00115044:
  pPVar8 = *(PHYSFS_Io **)((long)opaque + 0x20);
  *(undefined8 *)(puVar14 + -8) = 0x115054;
  iVar7 = zip_resolve(pPVar8,(ZIPinfo *)opaque,entry);
  if (iVar7 == 0) {
    return (PHYSFS_Io *)0x0;
  }
  if ((entry->tree).isdir != 0) {
    PVar15 = PHYSFS_ERR_NOT_A_FILE;
    goto LAB_0011522b;
  }
  *(undefined8 *)(puVar14 + -8) = 0x1150cb;
  pPVar8 = (PHYSFS_Io *)(*__PHYSFS_AllocatorHooks.Malloc)(0x50);
  if (pPVar8 == (PHYSFS_Io *)0x0) goto LAB_00115226;
  *(undefined8 *)(puVar14 + -8) = 0x1150e2;
  finfo = (ZIPfileinfo *)(*__PHYSFS_AllocatorHooks.Malloc)(0xa8);
  if (finfo == (ZIPfileinfo *)0x0) {
    *(undefined8 *)(puVar14 + -8) = 0x11524e;
    PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
    goto LAB_001152ee;
  }
  *(undefined8 *)(puVar14 + -8) = 0x1150fd;
  memset(finfo,0,0xa8);
  pPVar9 = *(PHYSFS_Io **)((long)opaque + 0x20);
  *(undefined8 *)(puVar14 + -8) = 0x11510d;
  pPVar9 = zip_get_io(pPVar9,(ZIPinfo *)opaque,entry);
  iVar7 = (int)opaque;
  if (pPVar9 != (PHYSFS_Io *)0x0) {
    finfo->io = pPVar9;
    pZVar10 = entry->symlink;
    if (entry->symlink == (ZIPentry *)0x0) {
      pZVar10 = entry;
    }
    finfo->entry = pZVar10;
    (finfo->stream).zalloc = (mz_alloc_func)0x0;
    (finfo->stream).zfree = (mz_free_func)0x0;
    (finfo->stream).opaque = (void *)0x0;
    *(undefined8 *)&(finfo->stream).data_type = 0;
    (finfo->stream).next_in = (uchar *)0x0;
    *(undefined8 *)&(finfo->stream).avail_in = 0;
    (finfo->stream).total_in = 0;
    (finfo->stream).next_out = (uchar *)0x0;
    *(undefined8 *)&(finfo->stream).avail_out = 0;
    (finfo->stream).total_out = 0;
    (finfo->stream).msg = (char *)0x0;
    (finfo->stream).state = (mz_internal_state *)0x0;
    (finfo->stream).adler = 0;
    (finfo->stream).reserved = 0;
    (finfo->stream).zalloc = zlibPhysfsAlloc;
    (finfo->stream).zfree = zlibPhysfsFree;
    (finfo->stream).opaque = &__PHYSFS_AllocatorHooks;
    if (pZVar10->compression_method == 0) {
LAB_001151c4:
      if ((entry->general_bits & 1) == 0) {
        if (pPVar17 == (PHYSFS_uint8 *)0x0) {
LAB_00115282:
          pPVar9 = &ZIP_Io;
          pPVar16 = pPVar8;
          for (lVar13 = 10; lVar13 != 0; lVar13 = lVar13 + -1) {
            uVar6 = *(undefined4 *)&pPVar9->field_0x4;
            pPVar16->version = pPVar9->version;
            *(undefined4 *)&pPVar16->field_0x4 = uVar6;
            pPVar9 = (PHYSFS_Io *)((long)pPVar9 + ((ulong)bVar18 * -2 + 1) * 8);
            pPVar16 = (PHYSFS_Io *)((long)pPVar16 + (ulong)bVar18 * -0x10 + 8);
          }
          pPVar8->opaque = finfo;
          return pPVar8;
        }
      }
      else if (pPVar17 != (PHYSFS_uint8 *)0x0) {
        p_Var1 = pPVar9->read;
        *(undefined8 *)(puVar14 + -8) = 0x115269;
        PVar12 = (*p_Var1)(pPVar9,local_44,0xc);
        if (PVar12 == 0xc) {
          *(undefined8 *)(puVar14 + -8) = 0x11527e;
          iVar7 = zip_prep_crypto_keys(finfo,local_44,pPVar17);
          if (iVar7 != 0) goto LAB_00115282;
        }
        goto LAB_001152ab;
      }
      PVar15 = PHYSFS_ERR_BAD_PASSWORD;
    }
    else {
      *(undefined8 *)(puVar14 + -8) = 0x115190;
      pPVar11 = (PHYSFS_uint8 *)(*__PHYSFS_AllocatorHooks.Malloc)(0x4000);
      finfo->buffer = pPVar11;
      if (pPVar11 != (PHYSFS_uint8 *)0x0) {
        *(undefined8 *)(puVar14 + -8) = 0x1151a9;
        iVar7 = mz_inflateInit2(&finfo->stream,iVar7);
        crypto_header._4_8_ = pPVar17;
        *(undefined8 *)(puVar14 + -8) = 0x1151b7;
        zlib_err(iVar7);
        pPVar17 = (PHYSFS_uint8 *)crypto_header._4_8_;
        if (iVar7 != 0) goto LAB_001152ab;
        goto LAB_001151c4;
      }
      PVar15 = PHYSFS_ERR_OUT_OF_MEMORY;
    }
    *(undefined8 *)(puVar14 + -8) = 0x1152ab;
    PHYSFS_setErrorCode(PVar15);
  }
LAB_001152ab:
  pPVar9 = finfo->io;
  if (pPVar9 != (PHYSFS_Io *)0x0) {
    p_Var2 = pPVar9->destroy;
    *(undefined8 *)(puVar14 + -8) = 0x1152b7;
    (*p_Var2)(pPVar9);
  }
  pPVar17 = finfo->buffer;
  if (pPVar17 != (PHYSFS_uint8 *)0x0) {
    *(undefined8 *)(puVar14 + -8) = 0x1152c6;
    (*__PHYSFS_AllocatorHooks.Free)(pPVar17);
    pmVar3 = (finfo->stream).state;
    if (pmVar3 != (mz_internal_state *)0x0) {
      pvVar4 = (finfo->stream).opaque;
      p_Var5 = (finfo->stream).zfree;
      *(undefined8 *)(puVar14 + -8) = 0x1152dd;
      (*p_Var5)(pvVar4,pmVar3);
      (finfo->stream).state = (mz_internal_state *)0x0;
    }
  }
  *(undefined8 *)(puVar14 + -8) = 0x1152ee;
  (*__PHYSFS_AllocatorHooks.Free)(finfo);
LAB_001152ee:
  *(undefined8 *)(puVar14 + -8) = 0x1152f7;
  (*__PHYSFS_AllocatorHooks.Free)(pPVar8);
  return (PHYSFS_Io *)0x0;
}

Assistant:

static PHYSFS_Io *ZIP_openRead(void *opaque, const char *filename)
{
    PHYSFS_Io *retval = NULL;
    ZIPinfo *info = (ZIPinfo *) opaque;
    ZIPentry *entry = zip_find_entry(info, filename);
    ZIPfileinfo *finfo = NULL;
    PHYSFS_Io *io = NULL;
    PHYSFS_uint8 *password = NULL;

    /* if not found, see if maybe "$PASSWORD" is appended. */
    if ((!entry) && (info->has_crypto))
    {
        const char *ptr = strrchr(filename, '$');
        if (ptr != NULL)
        {
            const size_t len = (size_t) (ptr - filename);
            char *str = (char *) __PHYSFS_smallAlloc(len + 1);
            BAIL_IF(!str, PHYSFS_ERR_OUT_OF_MEMORY, NULL);
            memcpy(str, filename, len);
            str[len] = '\0';
            entry = zip_find_entry(info, str);
            __PHYSFS_smallFree(str);
            password = (PHYSFS_uint8 *) (ptr + 1);
        } /* if */
    } /* if */

    BAIL_IF_ERRPASS(!entry, NULL);

    BAIL_IF_ERRPASS(!zip_resolve(info->io, info, entry), NULL);

    BAIL_IF(entry->tree.isdir, PHYSFS_ERR_NOT_A_FILE, NULL);

    retval = (PHYSFS_Io *) allocator.Malloc(sizeof (PHYSFS_Io));
    GOTO_IF(!retval, PHYSFS_ERR_OUT_OF_MEMORY, ZIP_openRead_failed);

    finfo = (ZIPfileinfo *) allocator.Malloc(sizeof (ZIPfileinfo));
    GOTO_IF(!finfo, PHYSFS_ERR_OUT_OF_MEMORY, ZIP_openRead_failed);
    memset(finfo, '\0', sizeof (ZIPfileinfo));

    io = zip_get_io(info->io, info, entry);
    GOTO_IF_ERRPASS(!io, ZIP_openRead_failed);
    finfo->io = io;
    finfo->entry = ((entry->symlink != NULL) ? entry->symlink : entry);
    initializeZStream(&finfo->stream);

    if (finfo->entry->compression_method != COMPMETH_NONE)
    {
        finfo->buffer = (PHYSFS_uint8 *) allocator.Malloc(ZIP_READBUFSIZE);
        if (!finfo->buffer)
            GOTO(PHYSFS_ERR_OUT_OF_MEMORY, ZIP_openRead_failed);
        else if (zlib_err(inflateInit2(&finfo->stream, -MAX_WBITS)) != Z_OK)
            goto ZIP_openRead_failed;
    } /* if */

    if (!zip_entry_is_tradional_crypto(entry))
        GOTO_IF(password != NULL, PHYSFS_ERR_BAD_PASSWORD, ZIP_openRead_failed);
    else
    {
        PHYSFS_uint8 crypto_header[12];
        GOTO_IF(password == NULL, PHYSFS_ERR_BAD_PASSWORD, ZIP_openRead_failed);
        if (io->read(io, crypto_header, 12) != 12)
            goto ZIP_openRead_failed;
        else if (!zip_prep_crypto_keys(finfo, crypto_header, password))
            goto ZIP_openRead_failed;
    } /* if */

    memcpy(retval, &ZIP_Io, sizeof (PHYSFS_Io));
    retval->opaque = finfo;

    return retval;

ZIP_openRead_failed:
    if (finfo != NULL)
    {
        if (finfo->io != NULL)
            finfo->io->destroy(finfo->io);

        if (finfo->buffer != NULL)
        {
            allocator.Free(finfo->buffer);
            inflateEnd(&finfo->stream);
        } /* if */

        allocator.Free(finfo);
    } /* if */

    if (retval != NULL)
        allocator.Free(retval);

    return NULL;
}